

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::Texture3DLodControlCase::iterate(Texture3DLodControlCase *this)

{
  ostringstream *this_00;
  TextureFormat TVar1;
  Texture3D *pTVar2;
  RenderContext *context;
  TestLog *pTVar3;
  int width;
  int height;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RenderTarget *pRVar9;
  int iVar10;
  Surface *pSVar11;
  byte bVar12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int iVar13;
  uint uVar14;
  void *pvVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  PixelFormat *pPVar19;
  int iVar20;
  undefined1 auVar21 [16];
  uint uVar22;
  uint uVar23;
  uint uVar24;
  RandomViewport viewport;
  int local_488;
  undefined1 local_480 [40];
  TextureRenderer *local_458;
  Surface renderedFrame;
  undefined1 local_438 [40];
  undefined1 local_410 [40];
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  undefined1 local_3b8 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture3DView local_368;
  PixelFormat *local_358;
  Texture3D *local_350;
  LookupPrecision local_348;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [6];
  undefined1 local_284 [76];
  size_type sStack_238;
  size_type local_230;
  int aiStack_228 [2];
  int local_220;
  undefined1 local_1f0 [32];
  int local_1d0;
  undefined1 auStack_1cc [84];
  ios_base local_178 [264];
  TextureFormatInfo fmtInfo;
  long lVar8;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  pTVar2 = this->m_texture;
  tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)&pTVar2->m_refTexture);
  iVar4 = (pTVar2->m_refTexture).m_width;
  iVar7 = (pTVar2->m_refTexture).m_height;
  local_350 = pTVar2;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar5),iVar4 << 2,iVar7 << 2,dVar6);
  iVar4 = viewport.width + 3;
  if (-1 < viewport.width) {
    iVar4 = viewport.width;
  }
  iVar7 = viewport.height + 3;
  if (-1 < viewport.height) {
    iVar7 = viewport.height;
  }
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_284,TEXTURETYPE_3D);
  glu::mapGLSampler((Sampler *)local_1f0,0x812f,0x812f,0x812f,this->m_minFilter,0x2600);
  local_220 = local_1d0;
  local_230 = local_1f0._16_8_;
  aiStack_228[0] = local_1f0._24_4_;
  aiStack_228[1] = local_1f0._28_4_;
  local_284._68_8_ = local_1f0._0_8_;
  sStack_238 = local_1f0._8_8_;
  local_284._4_4_ =
       glu::TextureTestUtil::getSamplerType
                 ((pTVar2->m_refTexture).super_TextureLevelPyramid.m_format);
  local_284._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_284._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_284._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_284._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_284._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_284._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_284._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_284._48_4_ = fmtInfo.lookupScale.m_data[3];
  (**(code **)(lVar8 + 0xb8))(0x806f,this->m_texture->m_glTexture);
  (**(code **)(lVar8 + 0x1360))(0x806f,0x2802,0x812f);
  (**(code **)(lVar8 + 0x1360))(0x806f,0x2803,0x812f);
  (**(code **)(lVar8 + 0x1360))(0x806f,0x8072,0x812f);
  (**(code **)(lVar8 + 0x1360))(0x806f,0x2801,this->m_minFilter);
  (**(code **)(lVar8 + 0x1360))(0x806f,0x2800,0x2600);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x86c);
  iVar4 = iVar4 >> 2;
  iVar7 = iVar7 >> 2;
  local_458 = &this->m_renderer;
  local_488 = 0;
  iVar5 = 0;
  do {
    iVar20 = 0;
    iVar13 = 0;
    for (iVar16 = 0; iVar16 != 4; iVar16 = iVar16 + 1) {
      iVar10 = viewport.width + iVar13;
      if (iVar16 != 3) {
        iVar10 = iVar4;
      }
      iVar17 = viewport.height - iVar5 * iVar7;
      if (iVar5 != 3) {
        iVar17 = iVar7;
      }
      getBasicTexCoord3D(&texCoord,local_488 + iVar16);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,(ulong)(uint)(local_488 + iVar16));
      (**(code **)(lVar8 + 0x1a00))(viewport.x + iVar20,viewport.y + iVar5 * iVar7,iVar10,iVar17);
      iVar13 = iVar13 - iVar4;
      iVar20 = iVar20 + iVar4;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_458,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(RenderParams *)local_284);
    }
    iVar5 = iVar5 + 1;
    local_488 = local_488 + 4;
  } while (iVar5 != 4);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  res.m_data[0] = 8;
  res.m_data[1] = 3;
  pvVar15 = (void *)renderedFrame.m_pixels.m_cap;
  if (renderedFrame.m_pixels.m_cap != 0) {
    pvVar15 = renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1f0,(TextureFormat *)&res,renderedFrame.m_width,
             renderedFrame.m_height,1,pvVar15);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f0);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar14 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
  pPVar19 = &pRVar9->m_pixelFormat;
  uVar14 = ~(uint)((uVar14 & 0xfffffffe) == 0x2702);
  local_348.uvwBits.m_data[1] = 0x10;
  local_348.uvwBits.m_data[2] = 0x10;
  local_348.colorThreshold.m_data[0] = 0.0;
  local_348.colorThreshold.m_data[1] = 0.0;
  local_348.colorThreshold.m_data[2] = 0.0;
  local_348.colorThreshold.m_data[3] = 0.0;
  local_348.colorMask.m_data[0] = true;
  local_348.colorMask.m_data[1] = true;
  local_348.colorMask.m_data[2] = true;
  local_348.colorMask.m_data[3] = true;
  lodPrec.rule = RULE_OPENGL;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_348.coordBits.m_data[0] = 0x14;
  local_348.coordBits.m_data[1] = 0x14;
  local_348.coordBits.m_data[2] = 0x14;
  local_348.uvwBits.m_data[0] = 0x10;
  uVar22 = uVar14 + pPVar19->redBits;
  uVar23 = uVar14 + (pRVar9->m_pixelFormat).greenBits;
  uVar24 = uVar14 + (pRVar9->m_pixelFormat).blueBits;
  uVar14 = uVar14 + (pRVar9->m_pixelFormat).alphaBits;
  res.m_data[1] = -(uint)(0 < (int)uVar23) & uVar23;
  res.m_data[0] = -(uint)(0 < (int)uVar22) & uVar22;
  res.m_data[3] = -(uint)(0 < (int)uVar14) & uVar14;
  res.m_data[2] = -(uint)(0 < (int)uVar24) & uVar24;
  tcu::computeFixedPointThreshold((tcu *)local_1f0,&res);
  auVar21._0_4_ = -(uint)(0 < pPVar19->redBits);
  auVar21._4_4_ = -(uint)(0 < (pRVar9->m_pixelFormat).greenBits);
  auVar21._8_4_ = -(uint)(0 < (pRVar9->m_pixelFormat).blueBits);
  auVar21._12_4_ = -(uint)(0 < (pRVar9->m_pixelFormat).alphaBits);
  uVar14 = movmskps((int)local_1f0,auVar21);
  bVar12 = (byte)uVar14;
  local_348.colorMask.m_data =
       (bool  [4])
       (uVar14 & 1 | (uint)((bVar12 & 2) >> 1) << 8 | (uint)((bVar12 & 4) >> 2) << 0x10 |
       (uint)(bVar12 >> 3) << 0x18);
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 8;
  iVar5 = 0;
  iVar13 = 0;
  iVar16 = 0;
  local_358 = pPVar19;
  do {
    iVar20 = iVar13 * iVar7;
    iVar17 = 0;
    iVar10 = 0;
    iVar18 = 0;
    local_458 = (TextureRenderer *)CONCAT44(local_458._4_4_,iVar13);
    do {
      width = viewport.width + iVar10;
      if (iVar18 != 3) {
        width = iVar4;
      }
      height = viewport.height - iVar20;
      if (iVar13 != 3) {
        height = iVar7;
      }
      getBasicTexCoord3D(&texCoord,iVar5 + iVar18);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                (this,local_284,(ulong)(uint)(iVar5 + iVar18));
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_1f0,&referenceFrame,local_358,iVar17,iVar20,width,height);
      res.m_data._8_8_ = (local_350->m_refTexture).m_view.m_levels;
      res.m_data[0] = (local_350->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_1f0,(Texture3DView *)&res,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_284);
      local_480._0_4_ = RGBA;
      local_480._4_4_ = UNORM_INT8;
      pvVar15 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar15 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)local_480,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar15);
      tcu::getSubregion((PixelBufferAccess *)local_1f0,(PixelBufferAccess *)&res,iVar17,iVar20,width
                        ,height);
      local_438._0_4_ = RGBA;
      local_438._4_4_ = UNORM_INT8;
      pvVar15 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar15 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_410,(TextureFormat *)local_438,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar15);
      tcu::getSubregion((PixelBufferAccess *)local_480,(PixelBufferAccess *)local_410,iVar17,iVar20,
                        width,height);
      local_368.m_numLevels = 8;
      local_368._4_4_ = 3;
      pvVar15 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar15 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3b8,(TextureFormat *)&local_368,errorMask.m_width,
                 errorMask.m_height,1,pvVar15);
      tcu::getSubregion((PixelBufferAccess *)local_438,(PixelBufferAccess *)local_3b8,iVar17,iVar20,
                        width,height);
      local_368.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
      local_368.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
      iVar13 = glu::TextureTestUtil::computeTextureLookupDiff
                         ((ConstPixelBufferAccess *)local_1f0,(ConstPixelBufferAccess *)local_480,
                          (PixelBufferAccess *)local_438,&local_368,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ReferenceParams *)local_284,&local_348,
                          &lodPrec,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
                                   ->m_watchDog);
      iVar18 = iVar18 + 1;
      iVar16 = iVar16 + iVar13;
      iVar10 = iVar10 - iVar4;
      iVar17 = iVar17 + iVar4;
      iVar13 = (int)local_458;
    } while (iVar18 != 4);
    iVar13 = (int)local_458 + 1;
    iVar5 = iVar5 + 4;
  } while (iVar13 != 4);
  if (0 < iVar16) {
    local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1f0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"ERROR: Image verification failed, found ",0x28);
    std::ostream::operator<<(this_00,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_178);
  }
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_480._0_8_ = (long)local_480 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"Result","");
  local_410._0_8_ = (long)local_410 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_480,(string *)local_410);
  tcu::TestLog::startImageSet(pTVar3,(char *)res.m_data._0_8_,local_2f8._M_p);
  local_438._0_8_ = (long)local_438 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Rendered","");
  TVar1 = (TextureFormat)((long)local_3b8 + 0x10);
  local_3b8._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"Rendered image","");
  pSVar11 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_1f0,(string *)local_438,(string *)local_3b8,pSVar11,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1f0,(int)pTVar3,__buf,(size_t)pSVar11);
  if ((undefined1 *)CONCAT44(auStack_1cc._0_4_,local_1d0) != auStack_1cc + 0xc) {
    operator_delete((undefined1 *)CONCAT44(auStack_1cc._0_4_,local_1d0),
                    CONCAT44(auStack_1cc._16_4_,auStack_1cc._12_4_) + 1);
  }
  if (local_1f0._0_8_ != (long)local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((TextureFormat)local_3b8._0_8_ != TVar1) {
    operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
  }
  if (local_438._0_8_ != (long)local_438 + 0x10) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_p != local_2e8) {
    operator_delete(local_2f8._M_p,local_2e8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != &local_308) {
    operator_delete((void *)res.m_data._0_8_,local_308._M_allocated_capacity + 1);
  }
  if (local_410._0_8_ != (long)local_410 + 0x10) {
    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
  }
  if (local_480._0_8_ != (long)local_480 + 0x10) {
    operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
  }
  if (0 < iVar16) {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_480._0_8_ = (long)local_480 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"Reference","");
    local_410._0_8_ = (long)local_410 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Ideal reference","");
    pSVar11 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_1f0,(string *)local_480,(string *)local_410,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar4 = (int)pTVar3;
    tcu::LogImage::write((LogImage *)local_1f0,iVar4,__buf_00,(size_t)pSVar11);
    local_438._0_8_ = (long)local_438 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ErrorMask","");
    local_3b8._0_8_ = TVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"Error mask","");
    pSVar11 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res,(string *)local_438,(string *)local_3b8,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res,iVar4,__buf_01,(size_t)pSVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != local_2e8) {
      operator_delete(local_2f8._M_p,local_2e8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != &local_308) {
      operator_delete((void *)res.m_data._0_8_,local_308._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_3b8._0_8_ != TVar1) {
      operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
    }
    if (local_438._0_8_ != (long)local_438 + 0x10) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    if ((undefined1 *)CONCAT44(auStack_1cc._0_4_,local_1d0) != auStack_1cc + 0xc) {
      operator_delete((undefined1 *)CONCAT44(auStack_1cc._0_4_,local_1d0),
                      CONCAT44(auStack_1cc._16_4_,auStack_1cc._12_4_) + 1);
    }
    if (local_1f0._0_8_ != (long)local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    if (local_410._0_8_ != (long)local_410 + 0x10) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    if (local_480._0_8_ != (long)local_480 + 0x10) {
      operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  description = "Pass";
  if (iVar16 != 0) {
    description = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar16 != 0),
             description);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

Texture3DLodControlCase::IterateResult Texture3DLodControlCase::iterate (void)
{
	const glw::Functions&			gl					= m_context.getRenderContext().getFunctions();

	const deUint32					wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32					wrapT				= GL_CLAMP_TO_EDGE;
	const deUint32					wrapR				= GL_CLAMP_TO_EDGE;
	const deUint32					magFilter			= GL_NEAREST;
	const tcu::Texture3D&			refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&		texFmt				= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	const int						texWidth			= refTexture.getWidth();
	const int						texHeight			= refTexture.getHeight();

	const tcu::RenderTarget&		renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport			viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	// Viewport is divided into 4x4 grid.
	const int						gridWidth			= 4;
	const int						gridHeight			= 4;
	const int						cellWidth			= viewport.width / gridWidth;
	const int						cellHeight			= viewport.height / gridHeight;

	tcu::Surface					renderedFrame		(viewport.width, viewport.height);
	vector<float>					texCoord;
	ReferenceParams					sampleParams		(TEXTURETYPE_3D);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(wrapS, wrapT, wrapR, m_minFilter, magFilter);
	sampleParams.samplerType	= getSamplerType(texFmt);
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;

	// Bind texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_3D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		wrapR);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int		curX		= cellWidth*gridX;
			int		curY		= cellHeight*gridY;
			int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord3D(texCoord, cellNdx);

			setTextureParams(cellNdx);

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord3D(texCoord, cellNdx);
				getReferenceParams(sampleParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}